

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O1

double __thiscall
nivalis::Expr::newton
          (Expr *this,uint64_t var_addr,double x0,Environment *env,double eps_step,double eps_abs,
          int max_iter,double xmin,double xmax,Expr *deriv,double fx0,double dfx0)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  Expr deriv_expr;
  double local_a0;
  Expr local_48;
  
  if (deriv == (Expr *)0x0) {
    diff(&local_48,this,var_addr,env);
    local_a0 = newton(this,var_addr,x0,env,eps_step,eps_abs,max_iter,xmin,xmax,&local_48,fx0,dfx0);
    if (local_48.ast.
        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.ast.
                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.ast.
                            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.ast.
                            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar1 = 0 < max_iter;
    if (0 < max_iter) {
      iVar2 = 1;
      do {
        if (iVar2 != 1) {
          (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[var_addr] = x0;
LAB_001ee57a:
          fx0 = operator()(this,env);
          if (!NAN(fx0)) {
LAB_001ee595:
            dfx0 = operator()(deriv,env);
            if (dfx0 != 0.0) goto LAB_001ee5d3;
          }
          local_a0 = NAN;
          break;
        }
        if ((dfx0 == 1.79769313486232e+308) && (!NAN(dfx0))) {
          (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[var_addr] = x0;
          if ((fx0 == 1.79769313486232e+308) && (!NAN(fx0))) goto LAB_001ee57a;
          goto LAB_001ee595;
        }
LAB_001ee5d3:
        x0 = x0 - fx0 / dfx0;
        if ((eps_step <= ABS(fx0 / dfx0)) || (eps_abs <= ABS(fx0))) {
          if ((x0 < xmin) || (bVar3 = true, xmax < x0)) {
            bVar3 = false;
            local_a0 = NAN;
          }
        }
        else {
          bVar3 = false;
          local_a0 = x0;
        }
        if (!bVar3) break;
        bVar1 = iVar2 < max_iter;
        bVar3 = iVar2 != max_iter;
        iVar2 = iVar2 + 1;
      } while (bVar3);
    }
    if (!bVar1) {
      local_a0 = NAN;
    }
  }
  return local_a0;
}

Assistant:

double Expr::newton(uint64_t var_addr, double x0, Environment& env,
        double eps_step, double eps_abs, int max_iter,
        double xmin, double xmax, const Expr* deriv,
        double fx0, double dfx0) const {
    if (deriv == nullptr) {
        Expr deriv_expr = diff(var_addr, env);
        return newton(var_addr, x0, env, eps_step,
                eps_abs, max_iter, xmin, xmax, &deriv_expr, fx0, dfx0);
    }
    NEWTON_PRINT("\n init@"); NEWTON_PRINT(x0);
    for (int i = 0; i < max_iter; ++i) {
        if (i || dfx0 == std::numeric_limits<double>::max()) {
            env.vars[var_addr] = x0;
            if (i || fx0 == std::numeric_limits<double>::max()) {
                fx0 = (*this)(env);
                if(std::isnan(fx0)) {
                    NEWTON_PRINT(" FAIL f=NAN");
                    return std::numeric_limits<double>::quiet_NaN(); // Fail
                }
            }
            dfx0 = (*deriv)(env);
            if(std::isnan(dfx0) || dfx0 == 0.) {
                NEWTON_PRINT(" FAIL d=NAN");
                return std::numeric_limits<double>::quiet_NaN(); // Fail
            }
        }
        double delta = fx0 / dfx0;
        x0 -= delta;
        NEWTON_PRINT(" "); NEWTON_PRINT(x0);
        if (std::fabs(delta) < eps_step && std::fabs(fx0) < eps_abs) {
            // Found root
            return x0;
        }
        if (x0 < xmin || x0 > xmax) {
            NEWTON_PRINT(" FAIL bounds");
            return std::numeric_limits<double>::quiet_NaN(); // Fail
        }
    }
    NEWTON_PRINT(" FAIL iter");
    return std::numeric_limits<double>::quiet_NaN(); // Fail
}